

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void __thiscall
vkb::PhysicalDeviceSelector::PhysicalDeviceSelector
          (PhysicalDeviceSelector *this,Instance *instance,VkSurfaceKHR surface)

{
  (this->instance_info).instance = (VkInstance)0x0;
  (this->instance_info).surface = (VkSurfaceKHR)0x0;
  (this->instance_info).version = 0x400000;
  (this->instance_info).headless = false;
  (this->instance_info).properties2_ext_enabled = false;
  (this->criteria).name._M_dataplus._M_p = (pointer)&(this->criteria).name.field_2;
  (this->criteria).name._M_string_length = 0;
  (this->criteria).name.field_2._M_local_buf[0] = '\0';
  (this->criteria).preferred_type = discrete;
  (this->criteria).allow_any_type = true;
  (this->criteria).require_present = true;
  (this->criteria).require_dedicated_transfer_queue = false;
  (this->criteria).require_dedicated_compute_queue = false;
  (this->criteria).require_separate_transfer_queue = false;
  (this->criteria).require_separate_compute_queue = false;
  (this->criteria).required_mem_size = 0;
  (this->criteria).required_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->criteria).required_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->criteria).required_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->criteria).required_version = 0x400000;
  memset(&(this->criteria).required_features,0,0xe0);
  memset(&(this->criteria).required_features2.pNext,0,0xe4);
  (this->criteria).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->criteria).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->criteria).extended_features_chain.nodes.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->criteria).extended_features_chain.nodes.
           super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->criteria).enable_portability_subset = true;
  (this->instance_info).instance = instance->instance;
  (this->instance_info).version = instance->instance_version;
  (this->instance_info).properties2_ext_enabled = instance->properties2_ext_enabled;
  (this->instance_info).surface = surface;
  (this->criteria).require_present = (bool)(instance->headless ^ 1);
  (this->criteria).required_version = instance->api_version;
  return;
}

Assistant:

PhysicalDeviceSelector::PhysicalDeviceSelector(Instance const& instance, VkSurfaceKHR surface) {
    instance_info.instance = instance.instance;
    instance_info.version = instance.instance_version;
    instance_info.properties2_ext_enabled = instance.properties2_ext_enabled;
    instance_info.surface = surface;
    criteria.require_present = !instance.headless;
    criteria.required_version = instance.api_version;
}